

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kvm.cpp
# Opt level: O0

void __thiscall Kvm::print(Kvm *this,Value *v,ostream *out)

{
  char cVar1;
  ValueType VVar2;
  ostream *this_00;
  char *local_50;
  _func_int **local_30;
  char *c_1;
  char c;
  ostream *out_local;
  Value *v_local;
  Kvm *this_local;
  
  if (((ulong)v & 1) == 1) {
    std::ostream::operator<<(out,(long)v >> 1);
  }
  else if (((ulong)v & 2) == 2) {
    cVar1 = (char)((long)v >> 2);
    std::operator<<(out,"#\\");
    if (cVar1 == '\n') {
      std::operator<<(out,"newline");
    }
    else if (cVar1 == ' ') {
      std::operator<<(out,"space");
    }
    else if (cVar1 == '\t') {
      std::operator<<(out,"tab");
    }
    else {
      std::operator<<(out,cVar1);
    }
  }
  else {
    VVar2 = Value::type(v);
    switch(VVar2) {
    case BOOLEAN:
      if (((ulong)v[1]._vptr_Value & 1) == 0) {
        local_50 = "#f";
      }
      else {
        local_50 = "#t";
      }
      std::operator<<(out,local_50);
      break;
    case STRING:
      std::operator<<(out,"\"");
      for (local_30 = v[1]._vptr_Value; *(char *)local_30 != '\0';
          local_30 = (_func_int **)((long)local_30 + 1)) {
        cVar1 = *(char *)local_30;
        if (cVar1 == '\n') {
          std::operator<<(out,"\\n");
        }
        else if (cVar1 == '\"') {
          std::operator<<(out,"\\\"");
        }
        else if (cVar1 == '\\') {
          std::operator<<(out,"\\\\");
        }
        else {
          std::operator<<(out,*(char *)local_30);
        }
      }
      std::operator<<(out,"\"");
      break;
    case NIL:
      std::operator<<(out,"()");
      break;
    case CELL:
      std::operator<<(out,"(");
      printCell(this,v,out);
      std::operator<<(out,")");
      break;
    case SYMBOL:
      std::operator<<(out,(char *)v[1]._vptr_Value);
      break;
    case PRIM_PROC:
      std::operator<<(out,"#<primitive-procedure");
      break;
    case COMP_PROC:
      std::operator<<(out,"#<compound-procedure>");
      break;
    case INPUT_PORT:
      std::operator<<(out,"#<input-port>");
      break;
    case OUTPUT_PORT:
      std::operator<<(out,"#<output-port>");
      break;
    case EOF_OBJECT:
      std::operator<<(out,"#<eof>");
      break;
    default:
      this_00 = std::operator<<((ostream *)&std::cerr,"cannot write unknown type");
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    }
  }
  return;
}

Assistant:

void Kvm::print(const Value *v, std::ostream& out)
{
    if (IS_INT(v))
    {
        out << TK_INT(v);
    } else if (IS_CHR(v))
    {
        char c = TK_CHR(v);
        out << "#\\";
        if (c == '\n')
        {
            out << "newline";
        } else if (c == ' ')
        {
            out << "space";
        } else if (c == '\t')
        {
            out << "tab";
        } else
        {
            out << c;
        }
    }
    else
    {
        switch (v->type())
        {
            case ValueType::BOOLEAN:
                out << (static_cast<const Boolean *>(v)->value_ ? "#t" : "#f");
                break;
            case ValueType::STRING:
                out << "\"";
                {
                    const char *c = static_cast<const String *>(v)->value_;
                    while (*c)
                    {
                        switch (*c)
                        {
                            case '\n':
                                out << "\\n";
                                break;
                            case '\\':
                                out << "\\\\";
                                break;
                            case '"':
                                out << "\\\"";
                                break;
                            default:
                                out << *c;
                                break;
                        }
                        ++c;
                    }
                }
                out << "\"";
                break;
            case ValueType::SYMBOL:
                out << static_cast<const Symbol *>(v)->value_;
                break;
            case ValueType::NIL:
                out << "()";
                break;
            case ValueType::CELL:
                out << "(";
                printCell(v, out);
                out << ")";
                break;
            case ValueType::PRIM_PROC:
                out << "#<primitive-procedure";
                break;
            case ValueType::COMP_PROC:
                out << "#<compound-procedure>";
                break;
            case ValueType::INPUT_PORT:
                out << "#<input-port>";
                break;
            case ValueType::OUTPUT_PORT:
                out << "#<output-port>";
                break;
            case ValueType::EOF_OBJECT:
                out << "#<eof>";
                break;
            default:
                cerr << "cannot write unknown type" << endl;
                break;
        }
    }
}